

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField(MapFieldBase *this)

{
  State SVar1;
  MutexLock local_20;
  MutexLock lock;
  ReflectionPayload *p;
  MapFieldBase *this_local;
  
  ConstAccess(this);
  SVar1 = state(this);
  if (SVar1 == STATE_MODIFIED_REPEATED) {
    lock.mu_ = (Mutex *)payload(this);
    absl::lts_20250127::MutexLock::MutexLock(&local_20,&((ReflectionPayload *)lock.mu_)->mutex);
    SVar1 = std::atomic<google::protobuf::internal::MapFieldBase::State>::load
                      ((atomic<google::protobuf::internal::MapFieldBase::State> *)(lock.mu_ + 4),
                       memory_order_relaxed);
    if (SVar1 == STATE_MODIFIED_REPEATED) {
      SyncMapWithRepeatedFieldNoLock(this);
      std::atomic<google::protobuf::internal::MapFieldBase::State>::store
                ((atomic<google::protobuf::internal::MapFieldBase::State> *)(lock.mu_ + 4),CLEAN,
                 memory_order_release);
    }
    absl::lts_20250127::MutexLock::~MutexLock(&local_20);
    ConstAccess(this);
  }
  return;
}

Assistant:

void MapFieldBase::SyncMapWithRepeatedField() const {
  ConstAccess();
  // acquire here matches with release below to ensure that we can only see a
  // value of CLEAN after all previous changes have been synced.
  if (state() == STATE_MODIFIED_REPEATED) {
    auto& p = payload();
    {
      absl::MutexLock lock(&p.mutex);
      // Double check state, because another thread may have seen the same state
      // and done the synchronization before the current thread.
      if (p.state.load(std::memory_order_relaxed) == STATE_MODIFIED_REPEATED) {
        const_cast<MapFieldBase*>(this)->SyncMapWithRepeatedFieldNoLock();
        p.state.store(CLEAN, std::memory_order_release);
      }
    }
    ConstAccess();
  }
}